

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

Script * cfd::core::ScriptUtil::CreateP2pkLockingScript
                   (Script *__return_storage_ptr__,Pubkey *pubkey)

{
  ScriptBuilder builder;
  ScriptBuilder local_30;
  
  local_30._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendData(&local_30,pubkey);
  ScriptBuilder::AppendOperator(&local_30,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
  ScriptBuilder::Build(__return_storage_ptr__,&local_30);
  local_30._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  if (local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkLockingScript(const Pubkey& pubkey) {
  // script作成
  ScriptBuilder builder;
  builder.AppendData(pubkey);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);

  return builder.Build();
}